

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSFrequencysatchannel.c
# Opt level: O2

int FANSFrequencysatchannel_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  byte *pbVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 uVar5;
  
  if (sptr == (void *)0x0) {
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar4 = td->name;
    uVar5 = 0x2b;
    pcVar2 = "%s: value not given (%s:%d)";
    sptr = (void *)0x0;
  }
  else {
    if (*(int *)((long)sptr + 8) == 0xc) {
      uVar3 = 0;
      do {
        if (0xb < uVar3) {
          return 0;
        }
        pbVar1 = (byte *)(*sptr + uVar3);
        uVar3 = uVar3 + 1;
      } while (permitted_alphabet_table_1[*pbVar1] != 0);
    }
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar4 = td->name;
    uVar5 = 0x38;
    pcVar2 = "%s: constraint failed (%s:%d)";
  }
  (*ctfailcb)(app_key,td,sptr,pcVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSFrequencysatchannel.c"
              ,uVar5);
  return -1;
}

Assistant:

int
FANSFrequencysatchannel_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	const NumericString_t *st = (const NumericString_t *)sptr;
	size_t size;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	size = st->size;
	
	if((size == 12)
		 && !check_permitted_alphabet_1(st)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}